

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs::iterate
          (TransformFeedbackOverflowQueryAdvancedSingleStreamInterleavedAttribs *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  string local_40;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
             super_TransformFeedbackOverflowQueryFunctionalBase.
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback2
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (**(code **)(lVar3 + 0x30))(0);
    TransformFeedbackOverflowQueryFunctionalBase::drawPoints
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,8);
    (**(code **)(lVar3 + 0xfe0))();
    TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0','\0','\0','\0','\0');
    TransformFeedbackOverflowQueryFunctionalBase::drawPoints
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,0xb);
    TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0','\0','\0','\0','\0');
    (**(code **)(lVar3 + 0x1248))();
    TransformFeedbackOverflowQueryFunctionalBase::drawPoints
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,1);
    (**(code **)(lVar3 + 0xfe0))();
    TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0','\0','\0','\0','\0');
    (**(code **)(lVar3 + 0x1248))();
    TransformFeedbackOverflowQueryFunctionalBase::drawPoints
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,2);
    (**(code **)(lVar3 + 0x638))();
    TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
              ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\x01','\x01','\0','\0','\0');
    tcu::TestContext::setTestResult
              ((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
               super_TransformFeedbackOverflowQueryFunctionalBase.
               super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Required transform_feedback2 extension is not supported","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// If GL 4.0 and ARB_transform_feedback2 are not supported then skip this
		// test case.
		if (!supportsTransformFeedback2())
		{
			throw tcu::NotSupportedError("Required transform_feedback2 extension is not supported");
		}

		// Call BeginTransformFeedback with mode POINTS.
		gl.beginTransformFeedback(GL_POINTS);

		// Start the query, submit draw that results in feeding back exactly 8
		// triangles, then stop the query.
		drawPoints(8);

		// Call PauseTransformFeedback.
		gl.pauseTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Start the query, submit draw that would result in feeding back more than
		// 10 points if transform feedback wasn't paused, then stop the query.
		drawPoints(11);

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Call ResumeTransformFeedback.
		gl.resumeTransformFeedback();

		// Start the query, submit draw that results in feeding back exactly 1
		// point, then stop the query.
		drawPoints(1);

		// Call PauseTransformFeedback.
		gl.pauseTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Call ResumeTransformFeedback.
		gl.resumeTransformFeedback();

		// Start the query, submit draw that results in feeding back exactly 2
		// point, then stop the query.
		drawPoints(2);

		// Call EndTransformFeedback.
		gl.endTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is TRUE.
		verifyQueryResults(GL_TRUE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}